

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynbuf.c
# Opt level: O0

CURLcode dyn_nappend(dynbuf *s,uchar *mem,size_t len)

{
  size_t sVar1;
  ulong uVar2;
  char *pcVar3;
  void *p;
  size_t fit;
  size_t a;
  size_t indx;
  size_t len_local;
  uchar *mem_local;
  dynbuf *s_local;
  
  sVar1 = s->leng;
  fit = s->allc;
  uVar2 = len + sVar1 + 1;
  if (s->toobig < uVar2) {
    curlx_dyn_free(s);
    s_local._4_4_ = CURLE_TOO_LARGE;
  }
  else {
    if (fit == 0) {
      if (s->toobig < 0x20) {
        fit = s->toobig;
      }
      else {
        fit = uVar2;
        if (uVar2 < 0x20) {
          fit = 0x20;
        }
      }
    }
    else {
      for (; fit < uVar2; fit = fit << 1) {
      }
      if (s->toobig < fit) {
        fit = s->toobig;
      }
    }
    if (fit != s->allc) {
      pcVar3 = (char *)realloc(s->bufr,fit);
      if (pcVar3 == (char *)0x0) {
        curlx_dyn_free(s);
        return CURLE_OUT_OF_MEMORY;
      }
      s->bufr = pcVar3;
      s->allc = fit;
    }
    if (len != 0) {
      memcpy(s->bufr + sVar1,mem,len);
    }
    s->leng = sVar1 + len;
    s->bufr[s->leng] = '\0';
    s_local._4_4_ = CURLE_OK;
  }
  return s_local._4_4_;
}

Assistant:

static CURLcode dyn_nappend(struct dynbuf *s,
                            const unsigned char *mem, size_t len)
{
  size_t indx = s->leng;
  size_t a = s->allc;
  size_t fit = len + indx + 1; /* new string + old string + zero byte */

  /* try to detect if there is rubbish in the struct */
  DEBUGASSERT(s->init == DYNINIT);
  DEBUGASSERT(s->toobig);
  DEBUGASSERT(indx < s->toobig);
  DEBUGASSERT(!s->leng || s->bufr);
  DEBUGASSERT(a <= s->toobig);
  DEBUGASSERT(!len || mem);

  if(fit > s->toobig) {
    Curl_dyn_free(s);
    return CURLE_TOO_LARGE;
  }
  else if(!a) {
    DEBUGASSERT(!indx);
    /* first invoke */
    if(MIN_FIRST_ALLOC > s->toobig)
      a = s->toobig;
    else if(fit < MIN_FIRST_ALLOC)
      a = MIN_FIRST_ALLOC;
    else
      a = fit;
  }
  else {
    while(a < fit)
      a *= 2;
    if(a > s->toobig)
      /* no point in allocating a larger buffer than this is allowed to use */
      a = s->toobig;
  }

  if(a != s->allc) {
    /* this logic is not using Curl_saferealloc() to make the tool not have to
       include that as well when it uses this code */
    void *p = realloc(s->bufr, a);
    if(!p) {
      Curl_dyn_free(s);
      return CURLE_OUT_OF_MEMORY;
    }
    s->bufr = p;
    s->allc = a;
  }

  if(len)
    memcpy(&s->bufr[indx], mem, len);
  s->leng = indx + len;
  s->bufr[s->leng] = 0;
  return CURLE_OK;
}